

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)1>_>::
ParticleTest_GetSetMomentum_Test
          (ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  ParticleTest<pica::Particle<(pica::Dimension)1>_>::ParticleTest
            (&this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>);
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.super_Test.
  _vptr_Test = (_func_int **)&PTR__Test_001f7938;
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetMomentum)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    MomentumType newMomentum(54.12e+4, -543.63e-2, 643.165e5);
    particle.setMomentum(newMomentum);
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_VECTOR(newMomentum, particle.getMomentum());
    GammaType expectedGamma = sqrt((FP)1 + newMomentum.norm2() / sqr(particle.getMass() * Constants<GammaType >::c()));
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}